

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

void __thiscall S2Polygon::S2Polygon(S2Polygon *this,S2Cell *cell)

{
  unique_ptr<S2Loop,_std::default_delete<S2Loop>_> local_30 [3];
  S2Cell *local_18;
  S2Cell *cell_local;
  S2Polygon *this_local;
  
  local_18 = cell;
  cell_local = (S2Cell *)this;
  S2Region::S2Region(&this->super_S2Region);
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Polygon_0062ea50;
  std::
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ::vector(&this->loops_);
  this->s2debug_override_ = ALLOW;
  S2LatLngRect::S2LatLngRect(&this->bound_);
  S2LatLngRect::S2LatLngRect(&this->subregion_bound_);
  MutableS2ShapeIndex::MutableS2ShapeIndex(&this->index_);
  absl::make_unique<S2Loop,S2Cell_const&>((absl *)local_30,local_18);
  Init(this,local_30);
  std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::~unique_ptr(local_30);
  return;
}

Assistant:

S2Polygon::S2Polygon(const S2Cell& cell)
    : s2debug_override_(S2Debug::ALLOW) {
  Init(make_unique<S2Loop>(cell));
}